

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNRPL.cpp
# Opt level: O0

NaPNEvent __thiscall NaNNRegrPlantLearn::run_net(NaNNRegrPlantLearn *this)

{
  char cVar1;
  byte bVar2;
  long *in_RDI;
  NaException *ex;
  NaPNEvent pnev;
  NaPNEvent local_20;
  NaPNEvent local_4;
  
  cVar1 = (char)in_RDI;
  bVar2 = NaPetriNet::prepare((bool)(cVar1 + '\b'));
  if ((bVar2 & 1) == 0) {
    NaPrintLog("IMPORTANT: verification failed!\n");
    local_4 = pneError;
  }
  else {
    do {
      local_20 = NaPetriNet::step_alive((bool)(cVar1 + '\b'));
      (**(code **)(*in_RDI + 0x28))();
    } while (local_20 == pneAlive);
    bVar2 = (**(code **)(*in_RDI + 0x20))();
    if ((bVar2 & 1) != 0) {
      local_20 = pneTerminate;
    }
    NaPetriNet::terminate((bool)(cVar1 + '\b'));
    local_4 = local_20;
  }
  return local_4;
}

Assistant:

NaPNEvent
NaNNRegrPlantLearn::run_net ()
{
    try{
        // Prepare petri net engine
        if(!net.prepare()){
            NaPrintLog("IMPORTANT: verification failed!\n");
        }
        else{
            NaPNEvent       pnev;

            // Activities cycle
            do{
	      pnev = net.step_alive();

                idle_entry();

            }while(pneAlive == pnev);

            if(user_break())
                pnev = pneTerminate;

            net.terminate();

            return pnev;
        }
    }
    catch(NaException& ex){
        NaPrintLog("EXCEPTION at runtime phase: %s\n", NaExceptionMsg(ex));
    }
    return pneError;
}